

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::ErrorHandlerImpl::taskFailed(ErrorHandlerImpl *this,Exception *exception)

{
  bool bVar1;
  bool local_41;
  undefined1 local_40 [7];
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_30;
  bool local_1a;
  DebugExpression<bool> local_19;
  Exception *pEStack_18;
  DebugExpression<bool> _kjCondition;
  Exception *exception_local;
  ErrorHandlerImpl *this_local;
  
  pEStack_18 = exception;
  local_30 = (ArrayPtr<const_char>)Exception::getDescription(exception);
  StringPtr::StringPtr((StringPtr *)local_40,"example TaskSet failure");
  local_1a = StringPtr::endsWith((StringPtr *)&local_30,(StringPtr *)local_40);
  local_19 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_19);
  if (!bVar1) {
    local_41 = kj::_::Debug::shouldLog(ERROR);
    while (local_41 != false) {
      kj::_::Debug::log<char_const(&)[80],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3b8,ERROR,
                 "\"failed: expected \" \"exception.getDescription().endsWith(\\\"example TaskSet failure\\\")\", _kjCondition"
                 ,(char (*) [80])
                  "failed: expected exception.getDescription().endsWith(\"example TaskSet failure\")"
                 ,&local_19);
      local_41 = false;
    }
  }
  this->exceptionCount = this->exceptionCount + 1;
  return;
}

Assistant:

void taskFailed(kj::Exception&& exception) override {
    EXPECT_TRUE(exception.getDescription().endsWith("example TaskSet failure"));
    ++exceptionCount;
  }